

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

const_iterator __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
::find(DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
       *this,const_arg_type_t<llvm::MCRegister> Val)

{
  bool bVar1;
  DenseMapPair<llvm::MCRegister,_int> *E;
  DenseMapPair<llvm::MCRegister,_int> *local_30;
  DenseMapPair<llvm::MCRegister,_int> *TheBucket;
  const_arg_type_t<llvm::MCRegister> Val_local;
  DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
  *this_local;
  
  TheBucket = (DenseMapPair<llvm::MCRegister,_int> *)Val;
  Val_local = (const_arg_type_t<llvm::MCRegister>)this;
  bVar1 = LookupBucketFor<llvm::MCRegister>(this,Val,&local_30);
  if (bVar1) {
    E = getBucketsEnd(this);
    _this_local = makeConstIterator(this,local_30,E,(DebugEpochBase *)this,true);
  }
  else {
    _this_local = end(this);
  }
  return _this_local;
}

Assistant:

const_iterator find(const_arg_type_t<KeyT> Val) const {
    const BucketT *TheBucket;
    if (LookupBucketFor(Val, TheBucket))
      return makeConstIterator(TheBucket, getBucketsEnd(), *this, true);
    return end();
  }